

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O0

void Curl_ssl_free_certinfo(Curl_easy *data)

{
  curl_certinfo *pcVar1;
  curl_certinfo *ci;
  int i;
  Curl_easy *data_local;
  
  pcVar1 = &(data->info).certs;
  if (pcVar1->num_of_certs != 0) {
    for (ci._4_4_ = 0; ci._4_4_ < pcVar1->num_of_certs; ci._4_4_ = ci._4_4_ + 1) {
      curl_slist_free_all((data->info).certs.certinfo[ci._4_4_]);
      (data->info).certs.certinfo[ci._4_4_] = (curl_slist *)0x0;
    }
    (*Curl_cfree)((data->info).certs.certinfo);
    (data->info).certs.certinfo = (curl_slist **)0x0;
    pcVar1->num_of_certs = 0;
  }
  return;
}

Assistant:

void Curl_ssl_free_certinfo(struct Curl_easy *data)
{
  int i;
  struct curl_certinfo *ci = &data->info.certs;

  if(ci->num_of_certs) {
    /* free all individual lists used */
    for(i = 0; i<ci->num_of_certs; i++) {
      curl_slist_free_all(ci->certinfo[i]);
      ci->certinfo[i] = NULL;
    }

    free(ci->certinfo); /* free the actual array too */
    ci->certinfo = NULL;
    ci->num_of_certs = 0;
  }
}